

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChArchiveOut::out<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
          (ChArchiveOut *this,
          ChNameValue<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          *bVal)

{
  byte *pbVar1;
  ChExceptionArchive *this_00;
  char *pcVar2;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *mvalp;
  char *pcVar3;
  undefined1 local_e0 [8];
  ChValueSpecific<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  specVal;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *local_38;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *mptr;
  size_t sStack_28;
  bool already_stored;
  size_t obj_ID;
  ChNameValue<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  *pCStack_18;
  bool tracked;
  ChNameValue<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  *bVal_local;
  ChArchiveOut *this_local;
  
  obj_ID._7_1_ = 0;
  sStack_28 = 0;
  pCStack_18 = bVal;
  bVal_local = (ChNameValue<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                *)this;
  pbVar1 = (byte *)ChNameValue<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ::flags(bVal);
  if ((*pbVar1 & 1) != 0) {
    local_38 = ChNameValue<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ::value(bVal);
    PutPointer(this,local_38,(bool *)((long)&mptr + 7),&stack0xffffffffffffffd8);
    if ((mptr._7_1_ & 1) != 0) {
      specVal._ptr_to_val._2_1_ = 1;
      this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
      pcVar2 = ChNameValue<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ::name(bVal);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_98,pcVar2,(allocator *)((long)&specVal._ptr_to_val + 3));
      std::operator+(&local_78,"Cannot serialize tracked object \'",&local_98);
      std::operator+(&local_58,&local_78,"\' by value, AFTER already serialized by pointer.");
      ChExceptionArchive::ChExceptionArchive(this_00,&local_58);
      specVal._ptr_to_val._2_1_ = 0;
      __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChExceptionArchive::~ChExceptionArchive);
    }
    obj_ID._7_1_ = 1;
  }
  mvalp = ChNameValue<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ::value(bVal);
  pcVar2 = ChNameValue<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ::name(bVal);
  pcVar3 = ChNameValue<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ::flags(bVal);
  ChValueSpecific<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
  ChValueSpecific((ChValueSpecific<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   *)local_e0,mvalp,pcVar2,*pcVar3);
  (*(this->super_ChArchive)._vptr_ChArchive[0xc])
            (this,(ChValueSpecific<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   *)local_e0,(ulong)(obj_ID._7_1_ & 1),sStack_28);
  ChValueSpecific<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
  ~ChValueSpecific((ChValueSpecific<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    *)local_e0);
  return;
}

Assistant:

void out (ChNameValue<T> bVal) {
          bool tracked = false;
          size_t obj_ID =0;
          if (bVal.flags() & NVP_TRACK_OBJECT)
          {
              bool already_stored; 
              T* mptr = &bVal.value();
              PutPointer(mptr, already_stored, obj_ID);
              if (already_stored) 
                  {throw (ChExceptionArchive( "Cannot serialize tracked object '" + std::string(bVal.name()) + "' by value, AFTER already serialized by pointer."));}
              tracked = true;
          }
          ChValueSpecific< T > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out(
              specVal,
              tracked, 
              obj_ID);
      }